

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

Page * __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FindPageToSplit(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
               BucketId targetBucket,bool findPreReservedHeapPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Page *pPVar4;
  Page *page;
  Iterator local_48;
  BucketId local_34;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_34 = targetBucket;
  do {
    local_34 = local_34 + Bucket256;
    if (LargeObjectList < local_34) {
      return (Page *)0x0;
    }
    local_48.list = this->buckets + local_34;
    local_48.current = &(local_48.list)->super_DListNodeBase<Memory::CustomHeap::Page>;
    while( true ) {
      if ((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_48.current ==
          (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_0061b006;
        *puVar3 = 0;
      }
      local_48.current =
           (((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_48.current)->
           super_DListNodeBase<Memory::CustomHeap::Page>).next.base;
      if ((DListBase<Memory::CustomHeap::Page,_RealCount> *)local_48.current == local_48.list)
      break;
      pPVar4 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data(&local_48);
      if (pPVar4->inFullList == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                           ,0x307,"(!pageInBucket.inFullList)","!pageInBucket.inFullList");
        if (!bVar2) {
LAB_0061b006:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if (((!findPreReservedHeapPages) ||
          (bVar2 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                   ::IsPreReservedSegment(this->codePageAllocators,pPVar4->segment), bVar2)) &&
         (bVar2 = Page::CanAllocate(pPVar4,targetBucket), bVar2)) {
        if ((findPreReservedHeapPages) && ((DAT_0145948a & 1) != 0)) {
          Output::Trace(CustomHeapPhase,
                        L"PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n");
        }
        if ((DAT_0145948a & 1) != 0) {
          Output::Trace(CustomHeapPhase,L"Found page to split. Moving from bucket %d to %d\n",
                        (ulong)(uint)local_34);
        }
        pPVar4 = AddPageToBucket(this,pPVar4,targetBucket,false);
        return pPVar4;
      }
    }
  } while( true );
}

Assistant:

Page* Heap<TAlloc, TPreReservedAlloc>::FindPageToSplit(BucketId targetBucket, bool findPreReservedHeapPages)
{
    for (BucketId b = (BucketId)(targetBucket + 1); b < BucketId::NumBuckets; b = (BucketId) (b + 1))
    {
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        FOREACH_DLISTBASE_ENTRY_EDITING(Page, pageInBucket, &this->buckets[b], bucketIter)
        {
            Assert(!pageInBucket.inFullList);
            if (findPreReservedHeapPages && !this->codePageAllocators->IsPreReservedSegment(pageInBucket.segment))
            {
                //Find only pages that are pre-reserved using preReservedHeapPageAllocator
                continue;
            }

            if (pageInBucket.CanAllocate(targetBucket))
            {
                Page* page = &pageInBucket;
                if (findPreReservedHeapPages)
                {
                    VerboseHeapTrace(_u("PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n"));
                }
                VerboseHeapTrace(_u("Found page to split. Moving from bucket %d to %d\n"), b, targetBucket);
                return AddPageToBucket(page, targetBucket);
            }
        }
        NEXT_DLISTBASE_ENTRY_EDITING;
    }

    return nullptr;
}